

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinc_resampler.cc
# Opt level: O0

float webrtc::SincResampler::Convolve_C
                (float *input_ptr,float *k1,float *k2,double kernel_interpolation_factor)

{
  long local_38;
  size_t n;
  float sum2;
  float sum1;
  double kernel_interpolation_factor_local;
  float *k2_local;
  float *k1_local;
  float *input_ptr_local;
  
  n._4_4_ = 0.0;
  n._0_4_ = 0.0;
  local_38 = 0x20;
  kernel_interpolation_factor_local = (double)k2;
  k2_local = k1;
  k1_local = input_ptr;
  while (local_38 != 0) {
    n._4_4_ = *k1_local * *k2_local + n._4_4_;
    n._0_4_ = *k1_local * *(float *)kernel_interpolation_factor_local + (float)n;
    local_38 = local_38 + -1;
    kernel_interpolation_factor_local = (double)((long)kernel_interpolation_factor_local + 4);
    k2_local = k2_local + 1;
    k1_local = k1_local + 1;
  }
  return (float)((1.0 - kernel_interpolation_factor) * (double)n._4_4_ +
                kernel_interpolation_factor * (double)(float)n);
}

Assistant:

float SincResampler::Convolve_C(const float* input_ptr, const float* k1,
                                const float* k2,
                                double kernel_interpolation_factor) {
  float sum1 = 0;
  float sum2 = 0;

  // Generate a single output sample.  Unrolling this loop hurt performance in
  // local testing.
  size_t n = kKernelSize;
  while (n--) {
    sum1 += *input_ptr * *k1++;
    sum2 += *input_ptr++ * *k2++;
  }

  // Linearly interpolate the two "convolutions".
  return static_cast<float>((1.0 - kernel_interpolation_factor) * sum1 +
      kernel_interpolation_factor * sum2);
}